

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (TSTNode<unsigned_short> *node,size_t depth)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  undefined1 extraout_AL;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  ushort uVar7;
  unsigned_short uVar8;
  long lVar9;
  DI __d;
  char local_49;
  long *local_48;
  DI local_40;
  size_t local_38;
  
  uVar8 = node->pivot;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_tst",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() pivot=",9);
  if (uVar8 == 0) {
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)node->pivot);
  }
  else {
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," depth=",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_40.i._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_40,1);
  local_40.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_38 = depth;
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
    plVar1 = (long *)(node->buckets)._M_elems[0];
    if (plVar1 == (long *)0x0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    }
    else {
      lVar6 = *plVar1;
      lVar2 = plVar1[1];
      local_48 = plVar1;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].size()=",9);
      lVar9 = lVar2 - lVar6 >> 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
      if (lVar2 != lVar6) {
        lVar6 = 0;
        do {
          lVar2 = *(long *)(*local_48 + lVar6 * 8);
          if (lVar2 == 0) goto LAB_002155e6;
          if (*(char *)(lVar2 + depth) == '\0') {
            uVar7 = 0;
          }
          else {
            uVar7 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
          }
          if (node->pivot <= uVar7) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"INVALID: ",9);
            pcVar3 = *(char **)(*local_48 + lVar6 * 8);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
            }
            else {
              sVar5 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," [pivot=",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
            depth = local_38;
          }
          if (node->pivot <= uVar7) {
            __assert_fail("ch < node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xb7,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned short]"
                         );
          }
          lVar6 = lVar6 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar6);
      }
    }
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              ((TSTNode<unsigned_short> *)(node->buckets)._M_elems[0],depth);
  }
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
    plVar1 = (long *)(node->buckets)._M_elems[1];
    if (plVar1 == (long *)0x0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    }
    else {
      lVar6 = *plVar1;
      lVar2 = plVar1[1];
      local_48 = plVar1;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].size()=",9);
      lVar9 = lVar2 - lVar6 >> 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
      if (lVar2 != lVar6) {
        lVar6 = 0;
        do {
          lVar2 = *(long *)(*local_48 + lVar6 * 8);
          if (lVar2 == 0) goto LAB_002155e6;
          if (*(char *)(lVar2 + depth) == '\0') {
            uVar8 = 0;
          }
          else {
            uVar8 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
          }
          if (uVar8 != node->pivot) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"INVALID: ",9);
            pcVar3 = *(char **)(*local_48 + lVar6 * 8);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
            }
            else {
              sVar5 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," [pivot=",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
            depth = local_38;
          }
          if (uVar8 != node->pivot) {
            __assert_fail("ch == node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xbd,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned short]"
                         );
          }
          lVar6 = lVar6 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar6);
      }
    }
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              ((TSTNode<unsigned_short> *)(node->buckets)._M_elems[1],depth + 2);
  }
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
    plVar1 = (long *)(node->buckets)._M_elems[2];
    if (plVar1 == (long *)0x0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    }
    else {
      lVar6 = *plVar1;
      lVar2 = plVar1[1];
      local_48 = plVar1;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].size()=",9);
      lVar9 = lVar2 - lVar6 >> 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
      if (lVar2 != lVar6) {
        lVar6 = 0;
        do {
          lVar2 = *(long *)(*local_48 + lVar6 * 8);
          if (lVar2 == 0) {
LAB_002155e6:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
          }
          if (*(char *)(lVar2 + depth) == '\0') {
            uVar7 = 0;
          }
          else {
            uVar7 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
          }
          if (uVar7 <= node->pivot) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"INVALID: ",9);
            pcVar3 = *(char **)(*local_48 + lVar6 * 8);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
            }
            else {
              sVar5 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," [pivot=",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
            depth = local_38;
          }
          if (uVar7 <= node->pivot) {
            __assert_fail("ch > node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xc3,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned short]"
                         );
          }
          lVar6 = lVar6 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar6);
      }
    }
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() buckets[",0xb);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              ((TSTNode<unsigned_short> *)(node->buckets)._M_elems[2],depth);
  }
  verify_tst<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_unsigned_short>::DI::
  ~DI(&local_40);
  return (bool)extraout_AL;
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}